

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

int __thiscall IsoWriter::allocateEntity(IsoWriter *this,FileEntryInfo *entity,int sectorNum)

{
  FileEntryInfo *this_00;
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_> *this_01;
  reference ppFVar4;
  FileEntryInfo **i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_> *__range1_1;
  FileEntryInfo **i;
  iterator __end1;
  iterator __begin1;
  vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_> *__range1;
  int local_1c;
  FileEntryInfo *pFStack_18;
  int sectorNum_local;
  FileEntryInfo *entity_local;
  IsoWriter *this_local;
  
  if (((entity->m_fileType == File) || (entity->m_fileType == RealtimeFile)) &&
     (entity->m_objectId != '\0')) {
    this->m_totalFiles = this->m_totalFiles + 1;
  }
  else if (entity->m_fileType == Directory) {
    this->m_totalDirectories = this->m_totalDirectories + 1;
  }
  local_1c = sectorNum;
  pFStack_18 = entity;
  entity_local = (FileEntryInfo *)this;
  iVar2 = FileEntryInfo::allocateEntity(entity,sectorNum);
  local_1c = iVar2 + local_1c;
  if (pFStack_18->m_objectId != '\0') {
    MappingEntry::MappingEntry
              ((MappingEntry *)((long)&__range1 + 4),pFStack_18->m_parent->m_sectorNum,
               pFStack_18->m_sectorNum);
    __range1._0_4_ = (uint)pFStack_18->m_objectId;
    pmVar3 = std::
             map<int,_MappingEntry,_std::less<int>,_std::allocator<std::pair<const_int,_MappingEntry>_>_>
             ::operator[](&this->m_mappingEntries,(key_type_conflict *)&__range1);
    *pmVar3 = stack0xffffffffffffffdc;
  }
  this_01 = &pFStack_18->m_files;
  __end1 = std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::begin(this_01);
  i = (FileEntryInfo **)std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::end(this_01)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<FileEntryInfo_**,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
                                     *)&i), this_00 = pFStack_18, bVar1) {
    ppFVar4 = __gnu_cxx::
              __normal_iterator<FileEntryInfo_**,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
              ::operator*(&__end1);
    local_1c = allocateEntity(this,*ppFVar4,local_1c);
    __gnu_cxx::
    __normal_iterator<FileEntryInfo_**,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::begin
                       (&pFStack_18->m_subDirs);
  i_1 = (FileEntryInfo **)
        std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::end(&this_00->m_subDirs);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<FileEntryInfo_**,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
                             *)&i_1), bVar1) {
    ppFVar4 = __gnu_cxx::
              __normal_iterator<FileEntryInfo_**,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
              ::operator*(&__end1_1);
    local_1c = allocateEntity(this,*ppFVar4,local_1c);
    __gnu_cxx::
    __normal_iterator<FileEntryInfo_**,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
    ::operator++(&__end1_1);
  }
  return local_1c;
}

Assistant:

int IsoWriter::allocateEntity(FileEntryInfo *entity, int sectorNum)
{
    if ((entity->m_fileType == FileTypes::File || entity->m_fileType == FileTypes::RealtimeFile) && entity->m_objectId)
        m_totalFiles++;
    else if (entity->m_fileType == FileTypes::Directory)
        m_totalDirectories++;

    sectorNum += entity->allocateEntity(sectorNum);
    if (entity->m_objectId)
        m_mappingEntries[entity->m_objectId] = MappingEntry(entity->m_parent->m_sectorNum, entity->m_sectorNum);

    for (const auto &i : entity->m_files) sectorNum = allocateEntity(i, sectorNum);
    for (const auto &i : entity->m_subDirs) sectorNum = allocateEntity(i, sectorNum);
    return sectorNum;
}